

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QSplitter::childEvent(QSplitter *this,QChildEvent *c)

{
  short sVar1;
  QSplitterPrivate *this_00;
  QWidget *pQVar2;
  QSplitterLayoutStruct *pQVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  qsizetype i;
  
  this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  sVar1 = *(short *)(c + 8);
  if (sVar1 == 0x47) {
    lVar5 = (this_00->list).d.size;
    if (lVar5 != 0) {
      i = 0;
      do {
        pQVar3 = (this_00->list).d.ptr[i];
        if (pQVar3->widget == *(QWidget **)(c + 0x10)) {
          QList<QSplitterLayoutStruct_*>::removeAt(&this_00->list,i);
          if (pQVar3->handle != (QSplitterHandle *)0x0) {
            (**(code **)(*(long *)&pQVar3->handle->super_QWidget + 0x20))();
          }
          operator_delete(pQVar3,0x28);
          QSplitterPrivate::recalc
                    (this_00,SUB21((ushort)(short)((this->super_QFrame).super_QWidget.data)->
                                                  widget_attributes >> 0xf,0));
          return;
        }
        i = i + 1;
      } while (lVar5 != i);
    }
  }
  else if (sVar1 == 0x45) {
    pQVar2 = *(QWidget **)(c + 0x10);
    if ((((((*(QWidgetPrivate **)&pQVar2->field_0x8)->field_0x30 & 1) != 0) &&
         (this_00->blockChildAdd == false)) &&
        (((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) &&
       (((*(byte *)(*(long *)(*(long *)&(this_00->super_QFramePrivate).super_QWidgetPrivate.
                                        field_0x8 + 0x20) + 9) & 0x80) != 0 &&
        (bVar4 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&pQVar2->field_0x8), !bVar4)
        ))) {
      QWidget::show(pQVar2);
      return;
    }
  }
  else if (sVar1 == 0x44) {
    pQVar2 = *(QWidget **)(c + 0x10);
    if ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) == 0) {
      lVar5 = QMetaObject::cast((QObject *)&QLayout::staticMetaObject);
      if (lVar5 != 0) {
        childEvent();
      }
    }
    else if ((this_00->blockChildAdd == false) &&
            (((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
      lVar5 = (this_00->list).d.size;
      if (lVar5 != 0) {
        lVar6 = 0;
        do {
          if ((this_00->list).d.ptr[lVar6]->widget == pQVar2) {
            return;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      QSplitterPrivate::insertWidget_helper(this_00,(int)lVar5,pQVar2,false);
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }